

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void * NULLC::AllocObject(int size,uint type)

{
  int iVar1;
  ulong *puVar2;
  uint *puVar3;
  uint uVar4;
  char *error;
  uint uVar5;
  Range range;
  Range local_30;
  
  if (size < 0) {
    error = "ERROR: requested memory size is less than zero";
LAB_0011d6bd:
    puVar2 = (ulong *)0x0;
    nullcThrowError(error);
  }
  else {
    uVar4 = size + 8;
    if (globalMemoryLimit < usedMemory + uVar4) {
      CollectMemory();
      if (globalMemoryLimit < usedMemory + uVar4) {
        error = "ERROR: reached global memory maximum";
        goto LAB_0011d6bd;
      }
    }
    else if (collectableMinimum < usedMemory + uVar4) {
      CollectMemory();
    }
    if ((int)uVar4 < 0x41) {
      if ((int)uVar4 < 0x11) {
        if ((int)uVar4 < 9) {
          puVar2 = (ulong *)ObjectBlockPool<8,_8192>::Alloc((ObjectBlockPool<8,_8192> *)pool8);
          iVar1 = 8;
        }
        else {
          puVar2 = (ulong *)ObjectBlockPool<16,_4096>::Alloc((ObjectBlockPool<16,_4096> *)pool16);
          iVar1 = 0x10;
        }
      }
      else if ((uint)size < 0x19) {
        puVar2 = (ulong *)ObjectBlockPool<32,_2048>::Alloc((ObjectBlockPool<32,_2048> *)pool32);
        iVar1 = 0x20;
      }
      else {
        puVar2 = (ulong *)ObjectBlockPool<64,_1024>::Alloc((ObjectBlockPool<64,_1024> *)pool64);
        iVar1 = 0x40;
      }
LAB_0011d673:
      usedMemory = usedMemory + iVar1;
      if (puVar2 == (ulong *)0x0) {
        error = "ERROR: allocation failed";
        goto LAB_0011d6bd;
      }
    }
    else {
      if ((uint)size < 0xf9) {
        if ((uint)size < 0x79) {
          puVar2 = (ulong *)ObjectBlockPool<128,_512>::Alloc((ObjectBlockPool<128,_512> *)pool128);
          iVar1 = 0x80;
        }
        else {
          puVar2 = (ulong *)ObjectBlockPool<256,_256>::Alloc((ObjectBlockPool<256,_256> *)pool256);
          iVar1 = 0x100;
        }
        goto LAB_0011d673;
      }
      if ((uint)size < 0x1f9) {
        puVar2 = (ulong *)ObjectBlockPool<512,_128>::Alloc((ObjectBlockPool<512,_128> *)pool512);
        iVar1 = 0x200;
        goto LAB_0011d673;
      }
      puVar3 = (uint *)alignedAlloc(size,0xc);
      if (puVar3 == (uint *)0x0) {
        error = "Allocation failed.";
        goto LAB_0011d6bd;
      }
      local_30.end = (void *)((long)puVar3 + (ulong)uVar4 + 4);
      local_30.start = puVar3;
      bigBlocks._24_8_ =
           Tree<NULLC::Range>::insert
                     ((Tree<NULLC::Range> *)bigBlocks,(node_type *)bigBlocks._24_8_,&local_30);
      *puVar3 = uVar4;
      puVar2 = (ulong *)(puVar3 + 1);
      usedMemory = usedMemory + uVar4;
    }
    if (type == 0) {
      uVar5 = 0;
    }
    else {
      if (*(uint *)(linker + 0x20c) <= type) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      uVar5 = (*(byte *)(*(long *)(linker + 0x200) + 0x15 + (ulong)type * 0x50) & 1) << 2;
    }
    memset(puVar2,0,(long)(int)uVar4);
    *puVar2 = (ulong)(type << 8 | uVar5);
    puVar2 = puVar2 + 1;
  }
  return puVar2;
}

Assistant:

void* NULLC::AllocObject(int size, unsigned type)
{
	if(size < 0)
	{
		nullcThrowError("ERROR: requested memory size is less than zero");
		return NULL;
	}

	void *data = NULL;
	size += sizeof(markerType);

	if((unsigned int)(usedMemory + size) > globalMemoryLimit)
	{
		CollectMemory();

		if((unsigned int)(usedMemory + size) > globalMemoryLimit)
		{
			nullcThrowError("ERROR: reached global memory maximum");
			return NULL;
		}
	}
	else if((unsigned int)(usedMemory + size) > collectableMinimum)
	{
		CollectMemory();
	}

	unsigned int realSize = size;
	if(size <= 64)
	{
		if(size <= 16)
		{
			if(size <= 8)
			{
				data = pool8.Alloc();
				realSize = 8;
			}else{
				data = pool16.Alloc();
				realSize = 16;
			}
		}else{
			if(size <= 32)
			{
				data = pool32.Alloc();
				realSize = 32;
			}else{
				data = pool64.Alloc();
				realSize = 64;
			}
		}
	}else{
		if(size <= 256)
		{
			if(size <= 128)
			{
				data = pool128.Alloc();
				realSize = 128;
			}else{
				data = pool256.Alloc();
				realSize = 256;
			}
		}else{
			if(size <= 512)
			{
				data = pool512.Alloc();
				realSize = 512;
			}else{
				void *ptr = NULLC::alignedAlloc(size - sizeof(markerType), 4 + sizeof(markerType));
				if(ptr == NULL)
				{
					nullcThrowError("Allocation failed.");
					return NULL;
				}

				Range range(ptr, (char*)ptr + size + 4);
				bigBlocks.insert(range);

				realSize = *(int*)ptr = size;
				data = (char*)ptr + 4;
			}
		}
	}
	usedMemory += realSize;

	if(data == NULL)
	{
		nullcThrowError("ERROR: allocation failed");
		return NULL;
	}
	int finalize = 0;
	if(type && (linker->exTypes[type].typeFlags & ExternTypeInfo::TYPE_HAS_FINALIZER))
		finalize = (int)OBJECT_FINALIZABLE;

	memset(data, 0, size);
	*(markerType*)data = finalize | (type << 8);
	return (char*)data + sizeof(markerType);
}